

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O2

iuIParamGenerator<bool> * __thiscall
iutest::detail::iuValueArray::operator_cast_to_iuIParamGenerator_(iuValueArray *this)

{
  iuValuesInParamsGenerator<std::__cxx11::string> *this_00;
  make_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ar;
  
  iuValueArray<const_char_*,_const_char_*>::
  make_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  make_array(&ar,(_MyTuple *)this);
  this_00 = (iuValuesInParamsGenerator<std::__cxx11::string> *)operator_new(0x28);
  iuValuesInParamsGenerator<std::__cxx11::string>::
  iuValuesInParamsGenerator<std::__cxx11::string,2ul>(this_00,ar.val);
  iuValueArray<const_char_*,_const_char_*>::
  make_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~make_array(&ar);
  return (iuIParamGenerator<bool> *)this_00;
}

Assistant:

operator iuIParamGenerator<T>* () const
    {
        make_array<T> ar(v);
#if !defined(IUTEST_NO_FUNCTION_TEMPLATE_ORDERING)
        return new iuValuesInParamsGenerator<T>(ar.val);
#else
        return new iuValuesInParamsGenerator<T>(ar.val, ar.val + IUTEST_PP_COUNTOF(ar.val));
#endif
    }